

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbcore.c
# Opt level: O0

void s3_am_init(kbcore_t *kbc)

{
  cmd_ln_t *config_00;
  feat_t *feat;
  senone_t *psVar1;
  int32 iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  int32 **subvecs_00;
  mdef_t *pmVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  mgau_model_t *pmVar10;
  s2_semi_mgau_t *psVar11;
  long lVar12;
  ms_mgau_model_t *pmVar13;
  tmat_t *ptVar14;
  double dVar15;
  double dVar16;
  char *local_b0;
  senone_t *sen;
  int32 **subvecs;
  cmd_ln_t *config;
  char *fn;
  kbcore_t *kbc_local;
  
  config_00 = kbc->config;
  kbc->mgau = (mgau_model_t *)0x0;
  kbc->ms_mgau = (ms_mgau_model_t *)0x0;
  s3_init_defaults(config_00);
  pcVar4 = cmd_ln_str_r(config_00,"-lda");
  if (pcVar4 != (char *)0x0) {
    err_msg(ERR_INFO,(char *)0x0,0,"Reading Feature Space Transform from: %s\n",pcVar4);
    feat = kbc->fcb;
    lVar5 = cmd_ln_int_r(config_00,"-ldadim");
    iVar2 = feat_read_lda(feat,pcVar4,(int32)lVar5);
    if (iVar2 < 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x10e,"LDA initialization failed.\n");
      exit(1);
    }
  }
  pcVar4 = cmd_ln_str_r(config_00,"-svspec");
  if (pcVar4 != (char *)0x0) {
    pcVar4 = cmd_ln_str_r(config_00,"-svspec");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
            ,0x114,"Using subvector specification %s\n",pcVar4);
    pcVar4 = cmd_ln_str_r(config_00,"-svspec");
    subvecs_00 = parse_subvecs(pcVar4);
    if (subvecs_00 == (int32 **)0x0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x116,"Subvector specification failed to parse.\n");
      exit(1);
    }
    iVar3 = feat_set_subvecs(kbc->fcb,subvecs_00);
    if (iVar3 < 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x118,"Failed to set subvector specification.\n");
      exit(1);
    }
  }
  err_msg(ERR_INFO,(char *)0x0,0,"Reading HMM in Sphinx 3 Model format\n");
  pcVar4 = cmd_ln_str_r(config_00,"-mdef");
  err_msg(ERR_INFO,(char *)0x0,0,"Model Definition File: %s\n",pcVar4);
  pcVar4 = cmd_ln_str_r(config_00,"-mean");
  err_msg(ERR_INFO,(char *)0x0,0,"Mean File: %s\n",pcVar4);
  pcVar4 = cmd_ln_str_r(config_00,"-var");
  err_msg(ERR_INFO,(char *)0x0,0,"Variance File: %s\n",pcVar4);
  pcVar4 = cmd_ln_str_r(config_00,"-mixw");
  err_msg(ERR_INFO,(char *)0x0,0,"Mixture Weight File: %s\n",pcVar4);
  pcVar4 = cmd_ln_str_r(config_00,"-tmat");
  err_msg(ERR_INFO,(char *)0x0,0,"Transition Matrices File: %s\n",pcVar4);
  pcVar4 = cmd_ln_str_r(config_00,"-mdef");
  pmVar6 = mdef_init(pcVar4,1);
  kbc->mdef = pmVar6;
  if (pmVar6 == (mdef_t *)0x0) {
    pcVar4 = cmd_ln_str_r(config_00,"-mdef");
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
            ,0x124,"mdef_init(%s) failed\n",pcVar4);
    exit(1);
  }
  mdef_report(kbc->mdef);
  pcVar4 = cmd_ln_str_r(kbc->config,"-senmgau");
  iVar3 = strcmp(pcVar4,".cont.");
  if (iVar3 == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
            ,0x12e,"Using optimized GMM computation for Continuous HMM, -topn will be ignored\n");
    pcVar7 = cmd_ln_str_r(config_00,"-mean");
    pcVar8 = cmd_ln_str_r(config_00,"-var");
    dVar15 = cmd_ln_float_r(config_00,"-varfloor");
    pcVar9 = cmd_ln_str_r(config_00,"-mixw");
    dVar16 = cmd_ln_float_r(config_00,"-mixwfloor");
    pmVar10 = mgau_init(pcVar7,pcVar8,(float64)(double)(float)dVar15,pcVar9,
                        (float64)(double)(float)dVar16,1,pcVar4,0x4e23,kbc->logmath);
    kbc->mgau = pmVar10;
    if (((kbc->mdef != (mdef_t *)0x0) && (kbc->mgau != (mgau_model_t *)0x0)) &&
       (kbc->mdef->n_sen != kbc->mgau->n_mgau)) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x13d,"Mdef #senones(%d) != mgau #senones(%d)\n",(ulong)(uint)kbc->mdef->n_sen,
              (ulong)(uint)kbc->mgau->n_mgau);
      exit(1);
    }
  }
  else {
    iVar3 = strcmp(pcVar4,".s2semi.");
    if (iVar3 == 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x143,"Using Sphinx2 multi-stream GMM computation\n");
      psVar11 = s2_semi_mgau_init(config_00,kbc->logmath,kbc->fcb,kbc->mdef);
      kbc->s2_mgau = psVar11;
      if (((kbc->mdef != (mdef_t *)0x0) && (kbc->s2_mgau != (s2_semi_mgau_t *)0x0)) &&
         (kbc->mdef->n_sen != kbc->s2_mgau->n_sen)) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                ,0x14b,"Mdef #senones(%d) != s2_semi_mgau #PDFs(%d)\n",(ulong)(uint)kbc->mdef->n_sen
                ,(ulong)(uint)kbc->s2_mgau->n_sen);
        exit(1);
      }
      pcVar4 = cmd_ln_str_r(config_00,"-kdtree");
      if (pcVar4 != (char *)0x0) {
        psVar11 = kbc->s2_mgau;
        lVar5 = cmd_ln_int_r(config_00,"-kdmaxdepth");
        lVar12 = cmd_ln_int_r(config_00,"-kdmaxbbi");
        iVar3 = s2_semi_mgau_load_kdtree(psVar11,pcVar4,(uint32)lVar5,(int32)lVar12);
        if (iVar3 < 0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                  ,0x154,"Failed to load kdtrees from %s\n",pcVar4);
          exit(1);
        }
      }
    }
    else {
      iVar3 = strcmp(pcVar4,".semi.");
      if (((iVar3 != 0) && (iVar3 = strcmp(pcVar4,".ptm."), iVar3 != 0)) &&
         (iVar3 = strcmp(pcVar4,".s3cont."), iVar3 != 0)) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                ,0x170,"Feature should be either .semi., .cont., or .ptm., is %s\n",pcVar4);
        exit(1);
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x15d,"Using multi-stream GMM computation\n");
      pcVar7 = cmd_ln_str_r(config_00,"-mean");
      pcVar8 = cmd_ln_str_r(config_00,"-var");
      dVar15 = cmd_ln_float_r(config_00,"-varfloor");
      pcVar9 = cmd_ln_str_r(config_00,"-mixw");
      dVar16 = cmd_ln_float_r(config_00,"-mixwfloor");
      iVar3 = cmd_ln_exists_r(config_00,"-lambda");
      if (iVar3 == 0) {
        local_b0 = (char *)0x0;
      }
      else {
        local_b0 = cmd_ln_str_r(config_00,"-lambda");
      }
      lVar5 = cmd_ln_int_r(config_00,"-topn");
      pmVar13 = ms_mgau_init(pcVar7,pcVar8,(float64)(double)(float)dVar15,pcVar9,
                             (float64)(double)(float)dVar16,1,pcVar4,local_b0,(int32)lVar5,
                             kbc->logmath,kbc->mdef);
      kbc->ms_mgau = pmVar13;
      psVar1 = kbc->ms_mgau->s;
      if (kbc->mdef->n_sen != psVar1->n_sen) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
                ,0x16d,"Model definition has %d senones; but #senone= %d\n",
                (ulong)(uint)kbc->mdef->n_sen,(ulong)(uint)psVar1->n_sen);
        exit(1);
      }
    }
  }
  pcVar4 = cmd_ln_str_r(config_00,"-tmat");
  dVar15 = cmd_ln_float_r(config_00,"-tmatfloor");
  ptVar14 = tmat_init(pcVar4,(float64)(double)(float)dVar15,1,kbc->logmath);
  kbc->tmat = ptVar14;
  if (ptVar14 == (tmat_t *)0x0) {
    pcVar4 = cmd_ln_str_r(config_00,"-tmat");
    dVar15 = cmd_ln_float_r(config_00,"-tmatfloor");
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
            ,0x179,"tmat_init (%s, %e) failed\n",(double)(float)dVar15,pcVar4);
    exit(1);
  }
  tmat_report(kbc->tmat);
  if ((kbc->mdef != (mdef_t *)0x0) && (kbc->tmat != (tmat_t *)0x0)) {
    if (kbc->mdef->n_tmat != kbc->tmat->n_tmat) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x183,"Mdef #tmat(%d) != tmatfile(%d)\n",(ulong)(uint)kbc->mdef->n_tmat,
              (ulong)(uint)kbc->tmat->n_tmat);
      exit(1);
    }
    if (kbc->mdef->n_emit_state != kbc->tmat->n_state) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/kbcore.c"
              ,0x186,"Mdef #states(%d) != tmat #states(%d)\n",(ulong)(uint)kbc->mdef->n_emit_state,
              (ulong)(uint)kbc->tmat->n_state);
      exit(1);
    }
  }
  return;
}

Assistant:

void
s3_am_init(kbcore_t * kbc)
{
    char const *fn;
    cmd_ln_t *config = kbcore_config(kbc);

    kbc->mgau = NULL;
    kbc->ms_mgau = NULL;

    s3_init_defaults(config);

    if ((fn = cmd_ln_str_r(config, "-lda"))) {
        E_INFO_NOFN("Reading Feature Space Transform from: %s\n", fn);
        if (feat_read_lda(kbcore_fcb(kbc), fn,
                          cmd_ln_int32_r(config, "-ldadim")) < 0)
            E_FATAL("LDA initialization failed.\n");
    }

    if (cmd_ln_str_r(config, "-svspec")) {
        int32 **subvecs;
        E_INFO("Using subvector specification %s\n", 
               cmd_ln_str_r(config, "-svspec"));
        if ((subvecs = parse_subvecs(cmd_ln_str_r(config, "-svspec"))) == NULL)
	    E_FATAL("Subvector specification failed to parse.\n");
        if ((feat_set_subvecs(kbcore_fcb(kbc), subvecs)) < 0)
	    E_FATAL("Failed to set subvector specification.\n");
    }

    E_INFO_NOFN("Reading HMM in Sphinx 3 Model format\n");
    E_INFO_NOFN("Model Definition File: %s\n", cmd_ln_str_r(config, "-mdef"));
    E_INFO_NOFN("Mean File: %s\n", cmd_ln_str_r(config, "-mean"));
    E_INFO_NOFN("Variance File: %s\n", cmd_ln_str_r(config, "-var"));
    E_INFO_NOFN("Mixture Weight File: %s\n", cmd_ln_str_r(config, "-mixw"));
    E_INFO_NOFN("Transition Matrices File: %s\n", cmd_ln_str_r(config, "-tmat"));

    if ((kbc->mdef = mdef_init(cmd_ln_str_r(config, "-mdef"),
                               REPORT_KBCORE)) == NULL)
        E_FATAL("mdef_init(%s) failed\n", cmd_ln_str_r(config, "-mdef"));

    if (REPORT_KBCORE) {
        mdef_report(kbc->mdef);
    }

    fn = cmd_ln_str_r(kbcore_config(kbc), "-senmgau");
    if (strcmp(fn, ".cont.") == 0) {
        /* Single stream optmized GMM computation Initialization */
        E_INFO
            ("Using optimized GMM computation for Continuous HMM, -topn will be ignored\n");
        kbc->mgau = mgau_init(cmd_ln_str_r(config, "-mean"),
                              cmd_ln_str_r(config, "-var"),
                              cmd_ln_float32_r(config, "-varfloor"),
                              cmd_ln_str_r(config, "-mixw"),
                              cmd_ln_float32_r(config, "-mixwfloor"),
                              TRUE,      /* Do precomputation */
                              (char *)fn,
                              MIX_INT_FLOAT_COMP,     /*Use hybrid integer and float routine */
                              kbc->logmath);

        if (kbc->mdef && kbc->mgau) {
            /* Verify senone parameters against model definition parameters */
            if (kbc->mdef->n_sen != mgau_n_mgau(kbc->mgau))
                E_FATAL("Mdef #senones(%d) != mgau #senones(%d)\n",
                        kbc->mdef->n_sen, mgau_n_mgau(kbc->mgau));
        }

    }
    else if (strcmp(fn, ".s2semi.") == 0) {
        /* SC_VQ initialization. */
        E_INFO("Using Sphinx2 multi-stream GMM computation\n");
        kbc->s2_mgau = s2_semi_mgau_init(config, kbc->logmath,
					 kbcore_fcb(kbc),
					 kbcore_mdef(kbc));
        if (kbc->mdef && kbc->s2_mgau) {
            /* Verify senone parameters against model definition parameters */
            if (kbc->mdef->n_sen != kbc->s2_mgau->n_sen)
                E_FATAL("Mdef #senones(%d) != s2_semi_mgau #PDFs(%d)\n",
                        kbc->mdef->n_sen, kbc->s2_mgau->n_sen);
        }
        /* FIXME: This should probably move as soon as we support kd-trees
         * for other model types. */
        if ((fn = cmd_ln_str_r(config, "-kdtree"))) {
            if (s2_semi_mgau_load_kdtree(kbc->s2_mgau,
                                         fn,
                                         cmd_ln_int32_r(config, "-kdmaxdepth"),
                                         cmd_ln_int32_r(config, "-kdmaxbbi")) < 0) {
                E_FATAL("Failed to load kdtrees from %s\n", fn);
            }
        }
    }
    else if (strcmp(fn, ".semi.") == 0
	     || strcmp(fn, ".ptm.") == 0
	     || strcmp(fn, ".s3cont.") == 0) {
        senone_t *sen;
        /* Multiple stream Gaussian mixture Initialization */
        E_INFO("Using multi-stream GMM computation\n");
        kbc->ms_mgau = ms_mgau_init(cmd_ln_str_r(config, "-mean"),
                                    cmd_ln_str_r(config, "-var"),
                                    cmd_ln_float32_r(config, "-varfloor"),
                                    cmd_ln_str_r(config, "-mixw"),
                                    cmd_ln_float32_r(config, "-mixwfloor"),
                                    TRUE,        /*Do precomputation */
                                    (char *)fn,
                                    cmd_ln_exists_r(config, "-lambda")
                                    ? cmd_ln_str_r(config, "-lambda") : NULL,
                                    cmd_ln_int32_r(config, "-topn"),
                                    kbc->logmath, kbc->mdef);
        sen = ms_mgau_senone(kbc->ms_mgau);
        /* Verify senone parameters against model definition parameters */
        if (kbc->mdef->n_sen != sen->n_sen)
            E_FATAL("Model definition has %d senones; but #senone= %d\n",
                    kbc->mdef->n_sen, sen->n_sen);
    }
    else {
        E_FATAL("Feature should be either .semi., .cont., or .ptm., is %s\n", fn);
    }


    /* STRUCTURE: Initialize the transition matrices */
    if ((kbc->tmat = tmat_init(cmd_ln_str_r(config, "-tmat"),
                               cmd_ln_float32_r(config, "-tmatfloor"),
                               REPORT_KBCORE, kbc->logmath)) == NULL)
        E_FATAL("tmat_init (%s, %e) failed\n", cmd_ln_str_r(config, "-tmat"),
                cmd_ln_float32_r(config, "-tmatfloor"));

    if (REPORT_KBCORE) {
        tmat_report(kbc->tmat);
    }

    if (kbc->mdef && kbc->tmat) {
        /* Verify transition matrices parameters against model definition parameters */
        if (kbc->mdef->n_tmat != kbc->tmat->n_tmat)
            E_FATAL("Mdef #tmat(%d) != tmatfile(%d)\n", kbc->mdef->n_tmat,
                    kbc->tmat->n_tmat);
        if (kbc->mdef->n_emit_state != kbc->tmat->n_state)
            E_FATAL("Mdef #states(%d) != tmat #states(%d)\n",
                    kbc->mdef->n_emit_state, kbc->tmat->n_state);
    }
}